

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

bool __thiscall TSMuxer::isSplitPoint(TSMuxer *this,AVPacket *avPacket)

{
  size_type sVar1;
  const_reference pvVar2;
  AVPacket *avPacket_local;
  TSMuxer *this_local;
  
  if ((avPacket->stream_index == this->m_mainStreamIndex) && ((avPacket->flags & 8) != 0)) {
    if (this->m_splitSize == 0) {
      if (this->m_splitDuration < 1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = this->m_splitDuration < avPacket->pts - this->m_curFileStartPts;
      }
    }
    else {
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&this->m_muxedPacketCnt);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_muxedPacketCnt,sVar1 - 1);
      this_local._7_1_ = this->m_splitSize < *pvVar2 * this->m_frameSize;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TSMuxer::isSplitPoint(const AVPacket& avPacket) const
{
    if (avPacket.stream_index != m_mainStreamIndex || !(avPacket.flags & AVPacket::IS_IFRAME))
        return false;

    if (m_splitSize > 0)
    {
        return m_muxedPacketCnt[m_muxedPacketCnt.size() - 1] * m_frameSize > m_splitSize;
    }
    if (m_splitDuration > 0)
    {
        return (avPacket.pts - m_curFileStartPts) > m_splitDuration;
    }

    return false;
}